

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

SourceFileFlags __thiscall
cmGeneratorTarget::GetTargetSourceFileFlags(cmGeneratorTarget *this,cmSourceFile *sf)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  cmMakefile *__s1;
  _Base_ptr in_RDX;
  cmTarget *extraout_RDX;
  cmTarget *extraout_RDX_00;
  cmTarget *pcVar4;
  SourceFileFlags SVar5;
  allocator local_59;
  string local_58;
  cmMakefile *local_38;
  char *location;
  _Self local_28;
  iterator si;
  cmSourceFile *sf_local;
  cmGeneratorTarget *this_local;
  SourceFileFlags *flags;
  
  si._M_node = in_RDX;
  SourceFileFlags::SourceFileFlags((SourceFileFlags *)this);
  ConstructSourceFileFlags((cmGeneratorTarget *)sf);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
       ::find((map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
               *)&sf[1].Location.Name,(key_type *)&si);
  location = (char *)std::
                     map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                     ::end((map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                            *)&sf[1].Location.Name);
  bVar1 = std::operator!=(&local_28,(_Self *)&location);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>
             ::operator->(&local_28);
    pcVar4 = *(cmTarget **)&ppVar3->second;
    this->Target = pcVar4;
    this->Makefile = (cmMakefile *)(ppVar3->second).MacFolder;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"MACOSX_PACKAGE_LOCATION",&local_59);
    __s1 = (cmMakefile *)cmSourceFile::GetProperty((cmSourceFile *)si._M_node,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    pcVar4 = extraout_RDX;
    if (__s1 != (cmMakefile *)0x0) {
      this->Makefile = __s1;
      local_38 = __s1;
      iVar2 = strcmp((char *)__s1,"Resources");
      pcVar4 = extraout_RDX_00;
      if (iVar2 == 0) {
        *(undefined4 *)&this->Target = 3;
      }
      else {
        *(undefined4 *)&this->Target = 4;
      }
    }
  }
  SVar5.MacFolder = (char *)pcVar4;
  SVar5._0_8_ = this;
  return SVar5;
}

Assistant:

struct cmGeneratorTarget::SourceFileFlags
cmGeneratorTarget::GetTargetSourceFileFlags(const cmSourceFile* sf) const
{
  struct SourceFileFlags flags;
  this->ConstructSourceFileFlags();
  std::map<cmSourceFile const*, SourceFileFlags>::iterator si =
    this->SourceFlagsMap.find(sf);
  if(si != this->SourceFlagsMap.end())
    {
    flags = si->second;
    }
  else
    {
    // Handle the MACOSX_PACKAGE_LOCATION property on source files that
    // were not listed in one of the other lists.
    if(const char* location = sf->GetProperty("MACOSX_PACKAGE_LOCATION"))
      {
      flags.MacFolder = location;
      if(strcmp(location, "Resources") == 0)
        {
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
        }
      else
        {
        flags.Type = cmGeneratorTarget::SourceFileTypeMacContent;
        }
      }
    }
  return flags;
}